

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O0

optional<unsigned_int> __thiscall
(anonymous_namespace)::KeyParser::
FromPKHBytes<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
          (KeyParser *this,
          __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          begin,__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                end)

{
  bool bVar1;
  difference_type dVar2;
  ulong uVar3;
  CPubKey *in_RDX;
  uchar *in_RDI;
  long in_FS_OFFSET;
  Key key;
  unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
  pubkey_provider;
  CPubKey pubkey;
  CKeyID keyid;
  uint160 hash;
  CPubKey *in_stack_ffffffffffffff18;
  KeyParser *in_stack_ffffffffffffff20;
  vector<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>,_std::allocator<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>_>_>
  *in_stack_ffffffffffffff28;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_ffffffffffffff40;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __first;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  ParseScriptContext in_stack_ffffffffffffff5c;
  _Optional_base<unsigned_int,_true,_true> local_7c;
  undefined1 local_71 [65];
  undefined1 local_30 [40];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  __first._M_current = in_RDI;
  dVar2 = __gnu_cxx::operator-
                    ((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)in_stack_ffffffffffffff28,
                     (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)in_stack_ffffffffffffff20);
  if (dVar2 != 0x14) {
    __assert_fail("end - begin == 20",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/descriptor.cpp"
                  ,0x6c9,
                  "std::optional<Key> (anonymous namespace)::KeyParser::FromPKHBytes(I, I) const [I = __gnu_cxx::__normal_iterator<unsigned char *, std::vector<unsigned char>>]"
                 );
  }
  if (*(long *)(in_RDI + 8) == 0) {
    __assert_fail("m_in",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/descriptor.cpp"
                  ,0x6ca,
                  "std::optional<Key> (anonymous namespace)::KeyParser::FromPKHBytes(I, I) const [I = __gnu_cxx::__normal_iterator<unsigned char *, std::vector<unsigned char>>]"
                 );
  }
  uint160::uint160((uint160 *)in_stack_ffffffffffffff18);
  base_blob<160U>::begin((base_blob<160U> *)in_stack_ffffffffffffff18);
  std::
  copy<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,unsigned_char*>
            (__first,in_stack_ffffffffffffff40,(uchar *)in_stack_ffffffffffffff28);
  CKeyID::CKeyID((CKeyID *)in_stack_ffffffffffffff18,(uint160 *)0x737c89);
  CPubKey::CPubKey(in_stack_ffffffffffffff18);
  uVar3 = (**(code **)(**(long **)(in_RDI + 8) + 0x20))(*(long **)(in_RDI + 8),local_30,local_71);
  if ((uVar3 & 1) != 0) {
    anon_unknown.dwarf_d00101::KeyParser::ParseContext(in_stack_ffffffffffffff20);
    anon_unknown.dwarf_d00101::InferPubkey
              (in_RDX,in_stack_ffffffffffffff5c,
               (SigningProvider *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                        *)in_stack_ffffffffffffff18);
    if (bVar1) {
      in_stack_ffffffffffffff28 =
           (vector<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>,_std::allocator<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>_>_>
            *)(in_RDI + 0x10);
      std::
      vector<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>,_std::allocator<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>_>_>
      ::size((vector<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>,_std::allocator<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>_>_>
              *)in_stack_ffffffffffffff18);
      std::
      vector<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>,_std::allocator<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>_>_>
      ::emplace_back<>(in_stack_ffffffffffffff28);
      std::
      vector<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>,_std::allocator<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>_>_>
      ::back((vector<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>,_std::allocator<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>_>_>
              *)in_stack_ffffffffffffff18);
      std::
      vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
      ::push_back((vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                   *)in_stack_ffffffffffffff18,(value_type *)0x737d2a);
      std::optional<unsigned_int>::optional<unsigned_int,_true>
                ((optional<unsigned_int> *)in_stack_ffffffffffffff28,
                 (uint *)in_stack_ffffffffffffff20);
    }
    std::
    unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
    ::~unique_ptr((unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                   *)in_stack_ffffffffffffff28);
    if (bVar1) goto LAB_00737d8d;
  }
  std::optional<unsigned_int>::optional((optional<unsigned_int> *)in_stack_ffffffffffffff18);
LAB_00737d8d:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (_Optional_base<unsigned_int,_true,_true>)
         (_Optional_base<unsigned_int,_true,_true>)
         local_7c._M_payload.super__Optional_payload_base<unsigned_int>;
}

Assistant:

std::optional<Key> FromPKHBytes(I begin, I end) const
    {
        assert(end - begin == 20);
        assert(m_in);
        uint160 hash;
        std::copy(begin, end, hash.begin());
        CKeyID keyid(hash);
        CPubKey pubkey;
        if (m_in->GetPubKey(keyid, pubkey)) {
            if (auto pubkey_provider = InferPubkey(pubkey, ParseContext(), *m_in)) {
                Key key = m_keys.size();
                m_keys.emplace_back();
                m_keys.back().push_back(std::move(pubkey_provider));
                return key;
            }
        }
        return {};
    }